

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_certificate_verify(ptls_t *tls,ptls_iovec_t message,char *context_string)

{
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var1;
  ushort uVar2;
  int iVar3;
  size_t sVar4;
  ushort uVar5;
  ulong msglen;
  uint8_t *msg;
  ptls_iovec_t pVar6;
  ptls_iovec_t pVar7;
  uint8_t signdata [226];
  
  msglen = message.len;
  msg = message.base;
  iVar3 = 0x32;
  if (((5 < (long)msglen) && ((msglen & 0x7ffffffffffffffe) != 6)) &&
     (uVar5 = *(ushort *)(msg + 6) << 8 | *(ushort *)(msg + 6) >> 8,
     msg + (ulong)uVar5 + 8 == msg + msglen && (ulong)uVar5 <= msglen - 8)) {
    uVar2 = *(ushort *)(msg + 4) << 8 | *(ushort *)(msg + 4) >> 8;
    if ((uVar2 == 0x804) || (uVar2 == 0x403)) {
      sVar4 = build_certificate_verify_signdata(signdata,tls->key_schedule,context_string);
      p_Var1 = (tls->certificate_verify).cb;
      if (p_Var1 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
        iVar3 = 0;
      }
      else {
        pVar6.len._0_2_ = uVar5;
        pVar6.base = msg + 8;
        pVar6.len._2_6_ = 0;
        pVar7.len = sVar4;
        pVar7.base = signdata;
        iVar3 = (*p_Var1)((tls->certificate_verify).verify_ctx,pVar7,pVar6);
      }
      (*ptls_clear_memory)(signdata,sVar4);
      (tls->certificate_verify).cb = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
      if (iVar3 == 0) {
        ptls__key_schedule_update_hash(tls->key_schedule,msg,msglen);
        iVar3 = 0;
      }
    }
    else {
      iVar3 = 0x2f;
    }
  }
  return iVar3;
}

Assistant:

static int handle_certificate_verify(ptls_t *tls, ptls_iovec_t message, const char *context_string)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    ptls_iovec_t signature;
    uint8_t signdata[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
    size_t signdata_size;
    int ret;

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        signature = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* validate */
    switch (algo) {
    case PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256:
    case PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256:
        /* ok */
        break;
    default:
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    signdata_size = build_certificate_verify_signdata(signdata, tls->key_schedule, context_string);
    if (tls->certificate_verify.cb != NULL) {
        ret = tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, ptls_iovec_init(signdata, signdata_size), signature);
    } else {
        ret = 0;
    }
    ptls_clear_memory(signdata, signdata_size);
    tls->certificate_verify.cb = NULL;
    if (ret != 0) {
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

Exit:
    return ret;
}